

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O1

void __thiscall hsql::TableRef::~TableRef(TableRef *this)

{
  vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *pvVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  
  this->_vptr_TableRef = (_func_int **)&PTR__TableRef_0012baf8;
  free(this->schema);
  free(this->name);
  free(this->alias);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if (this->join != (JoinDefinition *)0x0) {
    (*this->join->_vptr_JoinDefinition[1])();
  }
  pvVar1 = this->list;
  if (pvVar1 != (vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *)0x0) {
    ppTVar2 = (pvVar1->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar3 = (pvVar1->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar2;
        ppTVar3 = ppTVar3 + 1) {
      if (*ppTVar3 != (TableRef *)0x0) {
        (*(*ppTVar3)->_vptr_TableRef[1])();
      }
    }
    pvVar1 = this->list;
    if (pvVar1 != (vector<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_> *)0x0) {
      ppTVar3 = (pvVar1->super__Vector_base<hsql::TableRef_*,_std::allocator<hsql::TableRef_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (ppTVar3 != (pointer)0x0) {
        operator_delete(ppTVar3);
      }
      operator_delete(pvVar1);
      return;
    }
  }
  return;
}

Assistant:

TableRef::~TableRef() {
    free(schema);
    free(name);
    free(alias);

    delete select;
    delete join;

    if (list != NULL) {
      for (TableRef* table : *list) {
        delete table;
      }
      delete list;
    }
  }